

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

bool __thiscall QGraphicsViewPrivate::updateRect(QGraphicsViewPrivate *this,QRect *r)

{
  uint uVar1;
  ViewportUpdateMode VVar2;
  QWidgetData *pQVar3;
  bool bVar4;
  bool bVar5;
  QWidget *this_00;
  long in_FS_OFFSET;
  QRect local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(uint *)&this->field_0x300;
  if (((uVar1 >> 0xc & 1) == 0) && (VVar2 = this->viewportUpdateMode, VVar2 != NoViewportUpdate)) {
    this_00 = (this->super_QAbstractScrollAreaPrivate).viewport;
    pQVar3 = this_00->data;
    bVar5 = false;
    bVar4 = false;
    if (((r->x1).m_i <= ((pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i) + 1) &&
       (((bVar4 = bVar5, -1 < (r->x2).m_i &&
         ((r->y1).m_i < ((pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i) + 1)) &&
        (-1 < (r->y2).m_i)))) {
      bVar4 = true;
      if (VVar2 - MinimalViewportUpdate < 2) {
        if ((uVar1 >> 0xd & 1) != 0) {
          local_30 = (QRect)QRect::operator&(r,&this->updateClip);
          r = &local_30;
        }
        QRegion::operator+=(&this->dirtyRegion,r);
      }
      else {
        if (VVar2 == BoundingRectViewportUpdate) {
          if ((uVar1 >> 0xd & 1) != 0) {
            local_30 = (QRect)QRect::operator&(r,&this->updateClip);
            r = &local_30;
          }
          QRect_unite(&this->dirtyBoundingRect,r);
          if ((0 < (this->dirtyBoundingRect).x1.m_i) || (0 < (this->dirtyBoundingRect).y1.m_i))
          goto LAB_0062fc9d;
          this_00 = (this->super_QAbstractScrollAreaPrivate).viewport;
          pQVar3 = this_00->data;
          if (((this->dirtyBoundingRect).x2.m_i < (pQVar3->crect).x2.m_i - (pQVar3->crect).x1.m_i)
             || ((this->dirtyBoundingRect).y2.m_i < (pQVar3->crect).y2.m_i - (pQVar3->crect).y1.m_i)
             ) goto LAB_0062fc9d;
          this->field_0x301 = this->field_0x301 | 0x10;
        }
        else {
          if (VVar2 != FullViewportUpdate) goto LAB_0062fc9d;
          *(uint *)&this->field_0x300 = uVar1 | 0x1000;
        }
        QWidget::update(this_00);
      }
    }
  }
  else {
    bVar4 = false;
  }
LAB_0062fc9d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsViewPrivate::updateRect(const QRect &r)
{
    if (fullUpdatePending || viewportUpdateMode == QGraphicsView::NoViewportUpdate
        || !intersectsViewport(r, viewport->width(), viewport->height())) {
        return false;
    }

    switch (viewportUpdateMode) {
    case QGraphicsView::FullViewportUpdate:
        fullUpdatePending = true;
        viewport->update();
        break;
    case QGraphicsView::BoundingRectViewportUpdate:
        if (hasUpdateClip)
            QRect_unite(&dirtyBoundingRect, r & updateClip);
        else
            QRect_unite(&dirtyBoundingRect, r);
        if (containsViewport(dirtyBoundingRect, viewport->width(), viewport->height())) {
            fullUpdatePending = true;
            viewport->update();
        }
        break;
    case QGraphicsView::SmartViewportUpdate: // ### DEPRECATE
    case QGraphicsView::MinimalViewportUpdate:
        if (hasUpdateClip)
            dirtyRegion += r & updateClip;
        else
            dirtyRegion += r;
        break;
    default:
        break;
    }

    return true;
}